

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::setError(Scanner *this,Twine *Message,iterator Position)

{
  error_code *peVar1;
  iterator Message_00;
  error_code eVar2;
  ArrayRef<llvm::SMRange> local_48;
  SMLoc local_38;
  int local_30;
  undefined4 uStack_2c;
  error_category *local_28;
  iterator local_20;
  iterator Position_local;
  Twine *Message_local;
  Scanner *this_local;
  
  if (this->End <= this->Current) {
    this->Current = this->End + -1;
  }
  local_20 = Position;
  Position_local = (iterator)Message;
  Message_local = (Twine *)this;
  if (this->EC != (error_code *)0x0) {
    eVar2 = std::make_error_code(invalid_argument);
    local_28 = eVar2._M_cat;
    local_30 = eVar2._M_value;
    peVar1 = this->EC;
    *(ulong *)peVar1 = CONCAT44(uStack_2c,local_30);
    peVar1->_M_cat = local_28;
  }
  if ((this->Failed & 1U) == 0) {
    local_38 = SMLoc::getFromPointer(this->Current);
    Message_00 = Position_local;
    ArrayRef<llvm::SMRange>::ArrayRef(&local_48,None);
    printError(this,local_38,DK_Error,(Twine *)Message_00,local_48);
  }
  this->Failed = true;
  return;
}

Assistant:

void setError(const Twine &Message, StringRef::iterator Position) {
    if (Current >= End)
      Current = End - 1;

    // propagate the error if possible
    if (EC)
      *EC = make_error_code(std::errc::invalid_argument);

    // Don't print out more errors after the first one we encounter. The rest
    // are just the result of the first, and have no meaning.
    if (!Failed)
      printError(SMLoc::getFromPointer(Current), SourceMgr::DK_Error, Message);
    Failed = true;
  }